

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O1

void raptor::anon_unknown_0::log_default_print(LogArgument *args)

{
  char *__s;
  pthread_t *ppVar1;
  pthread_t pVar2;
  char *pcVar3;
  tm *ptVar4;
  size_t sVar5;
  char *pcVar6;
  char time_buffer [64];
  time_t timer;
  timeval now;
  tm stm;
  
  ppVar1 = (pthread_t *)__tls_get_addr(&PTR_00118fa0);
  if (*ppVar1 == 0) {
    pVar2 = pthread_self();
    *ppVar1 = pVar2;
  }
  time_buffer[0x30] = '\0';
  time_buffer[0x31] = '\0';
  time_buffer[0x32] = '\0';
  time_buffer[0x33] = '\0';
  time_buffer[0x34] = '\0';
  time_buffer[0x35] = '\0';
  time_buffer[0x36] = '\0';
  time_buffer[0x37] = '\0';
  time_buffer[0x38] = '\0';
  time_buffer[0x39] = '\0';
  time_buffer[0x3a] = '\0';
  time_buffer[0x3b] = '\0';
  time_buffer[0x3c] = '\0';
  time_buffer[0x3d] = '\0';
  time_buffer[0x3e] = '\0';
  time_buffer[0x3f] = '\0';
  time_buffer[0x20] = '\0';
  time_buffer[0x21] = '\0';
  time_buffer[0x22] = '\0';
  time_buffer[0x23] = '\0';
  time_buffer[0x24] = '\0';
  time_buffer[0x25] = '\0';
  time_buffer[0x26] = '\0';
  time_buffer[0x27] = '\0';
  time_buffer[0x28] = '\0';
  time_buffer[0x29] = '\0';
  time_buffer[0x2a] = '\0';
  time_buffer[0x2b] = '\0';
  time_buffer[0x2c] = '\0';
  time_buffer[0x2d] = '\0';
  time_buffer[0x2e] = '\0';
  time_buffer[0x2f] = '\0';
  time_buffer[0x10] = '\0';
  time_buffer[0x11] = '\0';
  time_buffer[0x12] = '\0';
  time_buffer[0x13] = '\0';
  time_buffer[0x14] = '\0';
  time_buffer[0x15] = '\0';
  time_buffer[0x16] = '\0';
  time_buffer[0x17] = '\0';
  time_buffer[0x18] = '\0';
  time_buffer[0x19] = '\0';
  time_buffer[0x1a] = '\0';
  time_buffer[0x1b] = '\0';
  time_buffer[0x1c] = '\0';
  time_buffer[0x1d] = '\0';
  time_buffer[0x1e] = '\0';
  time_buffer[0x1f] = '\0';
  time_buffer[0] = '\0';
  time_buffer[1] = '\0';
  time_buffer[2] = '\0';
  time_buffer[3] = '\0';
  time_buffer[4] = '\0';
  time_buffer[5] = '\0';
  time_buffer[6] = '\0';
  time_buffer[7] = '\0';
  time_buffer[8] = '\0';
  time_buffer[9] = '\0';
  time_buffer[10] = '\0';
  time_buffer[0xb] = '\0';
  time_buffer[0xc] = '\0';
  time_buffer[0xd] = '\0';
  time_buffer[0xe] = '\0';
  time_buffer[0xf] = '\0';
  __s = args->file;
  pcVar3 = strrchr(__s,0x2f);
  gettimeofday((timeval *)&now,(__timezone_ptr_t)0x0);
  timer = now.tv_sec;
  ptVar4 = localtime_r(&timer,(tm *)&stm);
  if (ptVar4 == (tm *)0x0) {
    builtin_strncpy(time_buffer,"error:localtime",0x10);
  }
  else {
    sVar5 = strftime(time_buffer,0x40,"%F %T",(tm *)&stm);
    if (sVar5 == 0) {
      builtin_strncpy(time_buffer,"error:strftime",0xf);
    }
  }
  pcVar6 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar6 = __s;
  }
  fprintf(_stderr,"[%s.%03u %5lu %c] %s (%s:%d)\n",time_buffer,now.tv_usec / 1000 & 0xffffffff,
          *ppVar1,(ulong)(uint)(int)*(char *)((long)&(anonymous_namespace)::g_level_string +
                                             (long)(int)args->level),args->message,pcVar6,
          (ulong)(uint)args->line);
  fflush(_stderr);
  return;
}

Assistant:

void log_default_print(LogArgument* args) {
#ifdef _WIN32
    static __declspec(thread) unsigned long tid = 0;
    if (tid == 0) tid = GetCurrentThreadId();
    constexpr char delimiter = '\\';
#else
    static __thread unsigned long tid = 0;
    if (tid == 0) tid = static_cast<unsigned long>(pthread_self());
    constexpr char delimiter = '/';
#endif
    const char* last_slash = NULL;
    const char* display_file = NULL;
    char time_buffer[64] = { 0 };

    last_slash = strrchr(args->file, delimiter);
    if (last_slash == NULL) {
        display_file = args->file;
    } else {
        display_file = last_slash + 1;
    }

    struct timeval now;
    gettimeofday(&now, nullptr);
    time_t timer = now.tv_sec;

#ifdef _WIN32
    struct tm stm;
    if (localtime_s(&stm, &timer)) {
        strcpy(time_buffer, "error:localtime");
    }
#else
    struct tm stm;
    if (!localtime_r(&timer, &stm)) {
        strcpy(time_buffer, "error:localtime");
    }
#endif
    // "%F %T" 2020-05-10 01:43:06
    else if (0 == strftime(time_buffer, sizeof(time_buffer), "%F %T", &stm)) {
        strcpy(time_buffer, "error:strftime");
    }

    fprintf(stderr,
        "[%s.%03u %5lu %c] %s (%s:%d)\n",
        time_buffer,
        (int)(now.tv_usec / 1000),  // millisecond
        tid,
        g_level_string[static_cast<int>(args->level)],
        args->message,
        display_file, args->line);

    fflush(stderr);
}